

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O0

ostream * __thiscall Al::internal::ProgressEngine::dump_state(ProgressEngine *this,ostream *ss)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  reference ppAVar4;
  ostream *in_RSI;
  long in_RDI;
  size_t i;
  size_t stage_queue_size;
  size_t stage;
  array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
  *pipeline;
  pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>
  *stream_pipeline_pair;
  iterator __end2;
  iterator __begin2;
  unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
  *__range2;
  ostream *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  string local_a0 [48];
  string local_70 [32];
  ulong local_50;
  size_type local_48;
  ulong local_40;
  array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
  *local_38;
  reference local_30;
  _Node_iterator_base<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false>
  local_20;
  long local_18;
  ostream *local_10;
  
  local_18 = in_RDI + 0x8088;
  local_10 = in_RSI;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
       ::begin((unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
                *)in_stack_ffffffffffffff38);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
       ::end((unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
              *)in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_30 = std::__detail::
               _Node_iterator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false,_false>
               ::operator*((_Node_iterator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false,_false>
                            *)0x1375c2);
    poVar2 = std::operator<<(local_10,"Pipelined run queue for stream ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30->first);
    std::operator<<(poVar2,":\n");
    local_38 = &local_30->second;
    for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
      pvVar3 = std::
               array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
               ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                             *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      local_48 = std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::
                 size(pvVar3);
      poVar2 = std::operator<<(local_10,"Stage ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_40);
      poVar2 = std::operator<<(poVar2," run queue (");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_48);
      std::operator<<(poVar2,"):\n");
      for (local_50 = 0; local_50 < local_48; local_50 = local_50 + 1) {
        poVar2 = (ostream *)std::ostream::operator<<(local_10,local_50);
        std::operator<<(poVar2,": ");
        pvVar3 = std::
                 array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                 ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                               *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
        ppAVar4 = std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::
                  operator[](pvVar3,local_50);
        poVar2 = local_10;
        if (*ppAVar4 == (value_type)0x0) {
          std::operator<<(local_10,"(unknown)\n");
        }
        else {
          pvVar3 = std::
                   array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                   ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                                 *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
          ppAVar4 = std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::
                    operator[](pvVar3,local_50);
          (**(code **)(*(long *)*ppAVar4 + 0x30))();
          poVar2 = std::operator<<(poVar2,local_70);
          in_stack_ffffffffffffff40 = std::operator<<(poVar2," ");
          pvVar3 = std::
                   array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                   ::operator[]((array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>
                                 *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
          ppAVar4 = std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>::
                    operator[](pvVar3,local_50);
          (**(code **)(*(long *)*ppAVar4 + 0x38))(local_a0);
          in_stack_ffffffffffffff38 = std::operator<<(in_stack_ffffffffffffff40,local_a0);
          std::operator<<(in_stack_ffffffffffffff38,"\n");
          std::__cxx11::string::~string(local_a0);
          std::__cxx11::string::~string(local_70);
        }
      }
    }
    std::__detail::
    _Node_iterator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false,_false>
    ::operator++((_Node_iterator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_false,_false>
                  *)in_stack_ffffffffffffff40);
  }
  return local_10;
}

Assistant:

std::ostream& ProgressEngine::dump_state(std::ostream& ss) {
  // Note: This pulls *directly from internal state*.
  // This is *not* thread safe, and stuff might blow up.
  // You should only be dumping state where you don't care about that anyway.
  for (auto&& stream_pipeline_pair : run_queues) {
    ss << "Pipelined run queue for stream " << stream_pipeline_pair.first << ":\n";
    auto&& pipeline = stream_pipeline_pair.second;
    for (size_t stage = 0; stage < AL_PE_NUM_PIPELINE_STAGES; ++stage) {
      const size_t stage_queue_size = pipeline[stage].size();
      ss << "Stage " << stage << " run queue (" << stage_queue_size << "):\n";
      for (size_t i = 0; i < stage_queue_size; ++i) {
        ss << i << ": ";
        if (pipeline[stage][i]) {
          ss << pipeline[stage][i]->get_name() << " "
             << pipeline[stage][i]->get_desc() << "\n";
        } else {
          ss << "(unknown)\n";
        }
      }
    }
  }
  return ss;
}